

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O0

int __thiscall
QAccessibleMenuBar::indexOfChild(QAccessibleMenuBar *this,QAccessibleInterface *child)

{
  long lVar1;
  int iVar2;
  QMenuBar *pQVar3;
  qsizetype qVar4;
  long *in_RSI;
  QListSpecialMethodsBase<QAction_*> *in_RDI;
  long in_FS_OFFSET;
  Role r;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (**(code **)(*in_RSI + 0x78))();
  if ((iVar2 == 0xc) || (iVar2 == 0x15)) {
    pQVar3 = menuBar((QAccessibleMenuBar *)0x7db301);
    if (pQVar3 != (QMenuBar *)0x0) {
      menuBar((QAccessibleMenuBar *)0x7db311);
      QWidget::actions((QWidget *)CONCAT44(iVar2,in_stack_ffffffffffffffb8));
      (**(code **)(*in_RSI + 0x18))();
      qobject_cast<QAction*>((QObject *)0x7db331);
      qVar4 = QListSpecialMethodsBase<QAction*>::indexOf<QAction*>
                        (in_RDI,(QAction **)
                                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         0x7db349);
      local_2c = (int)qVar4;
      QList<QAction_*>::~QList((QList<QAction_*> *)0x7db357);
      goto LAB_007db361;
    }
  }
  local_2c = -1;
LAB_007db361:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleMenuBar::indexOfChild(const QAccessibleInterface *child) const
{
    QAccessible::Role r = child->role();
    if ((r == QAccessible::MenuItem || r == QAccessible::Separator) && menuBar()) {
        return menuBar()->actions().indexOf(qobject_cast<QAction*>(child->object()));
    }
    return -1;
}